

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int arkSetRootDirection(void *arkode_mem,int *rootdir)

{
  long lVar1;
  long lVar2;
  int iVar3;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar3 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
  }
  else {
    lVar1 = *(long *)((long)arkode_mem + 0x280);
    if (lVar1 == 0) {
      msgfmt = "arkode_mem = NULL illegal.";
      iVar3 = -0x15;
    }
    else {
      iVar3 = *(int *)(lVar1 + 8);
      if (iVar3 != 0) {
        for (lVar2 = 0; lVar2 < iVar3; lVar2 = lVar2 + 1) {
          *(int *)(*(long *)(lVar1 + 0x18) + lVar2 * 4) = rootdir[lVar2];
          iVar3 = *(int *)(lVar1 + 8);
        }
        return 0;
      }
      msgfmt = "Rootfinding was not initialized.";
      iVar3 = -0x16;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,iVar3,"ARKode","arkSetRootDirection",msgfmt);
  return iVar3;
}

Assistant:

int arkSetRootDirection(void *arkode_mem, int *rootdir)
{
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;
  int i;

  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetRootDirection", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  if (ark_mem->root_mem == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode",
                    "arkSetRootDirection", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_root_mem = (ARKodeRootMem) ark_mem->root_mem;

  if (ark_root_mem->nrtfn == 0) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSetRootDirection", MSG_ARK_NO_ROOT);
    return(ARK_ILL_INPUT);
  }
  for(i=0; i<ark_root_mem->nrtfn; i++)
    ark_root_mem->rootdir[i] = rootdir[i];
  return(ARK_SUCCESS);
}